

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                     *that)

{
  allocator_type *in_stack_000000a0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_000000a8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_000000b0;
  allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *in_stack_ffffffffffffffb8;
  
  alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
             *)0x25aa37);
  allocator_traits<std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::
  select_on_container_copy_construction(in_stack_ffffffffffffffb8);
  raw_hash_set(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>::~allocator
            ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)0x25aa69);
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that)
				: raw_hash_set(that, AllocTraits::select_on_container_copy_construction(
				                   that.alloc_ref())) {}